

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall
TMap<int,_FPlayerColorSet,_THashTraits<int>,_TValueTraits<FPlayerColorSet>_>::Resize
          (TMap<int,_FPlayerColorSet,_THashTraits<int>,_TValueTraits<FPlayerColorSet>_> *this,
          hash_t nhsize)

{
  undefined8 *puVar1;
  BYTE *pBVar2;
  uint uVar3;
  Node *block;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  Node *pNVar7;
  long lVar8;
  
  uVar3 = this->Size;
  block = this->Nodes;
  SetNodeVector(this,nhsize);
  this->NumUsed = 0;
  if ((ulong)uVar3 != 0) {
    lVar8 = 0;
    do {
      if (*(long *)((long)((block->Pair).Value.Extra + -6) + lVar8) != 1) {
        pNVar7 = NewKey(this,*(int *)((long)((block->Pair).Value.Extra + -4) + lVar8));
        (pNVar7->Pair).Value.Name.Index =
             *(int *)((long)&(((FPlayerColorSet *)((block->Pair).Value.Extra + -3))->Name).Index +
                     lVar8);
        puVar1 = (undefined8 *)((long)((block->Pair).Value.Extra + -2) + lVar8);
        uVar4 = *puVar1;
        uVar5 = puVar1[1];
        pBVar2 = &(block->Pair).Value.Extra[2].RangeStart + lVar8;
        uVar6 = *(undefined8 *)(pBVar2 + 8);
        *(undefined8 *)((pNVar7->Pair).Value.Extra + 2) = *(undefined8 *)pBVar2;
        *(undefined8 *)((pNVar7->Pair).Value.Extra + 4) = uVar6;
        (pNVar7->Pair).Value.Lump = (int)uVar4;
        (pNVar7->Pair).Value.FirstColor = (char)((ulong)uVar4 >> 0x20);
        (pNVar7->Pair).Value.LastColor = (char)((ulong)uVar4 >> 0x28);
        (pNVar7->Pair).Value.RepresentativeColor = (char)((ulong)uVar4 >> 0x30);
        (pNVar7->Pair).Value.NumExtraRanges = (char)((ulong)uVar4 >> 0x38);
        *(undefined8 *)(pNVar7->Pair).Value.Extra = uVar5;
      }
      lVar8 = lVar8 + 0x30;
    } while ((ulong)uVar3 * 0x30 != lVar8);
  }
  M_Free(block);
  return;
}

Assistant:

void Resize(hash_t nhsize)
	{
		hash_t i, oldhsize = Size;
		Node *nold = Nodes;
		/* create new hash part with appropriate size */
		SetNodeVector(nhsize);
		/* re-insert elements from hash part */
		NumUsed = 0;
		for (i = 0; i < oldhsize; ++i)
		{
			if (!nold[i].IsNil())
			{
				Node *n = NewKey(nold[i].Pair.Key);
				::new(&n->Pair.Value) VT(nold[i].Pair.Value);
				nold[i].~Node();
			}
		}
		M_Free(nold);
	}